

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<ProKey,ProString>::tryEmplace_impl<ProKey_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,ProKey *key)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  long lVar4;
  size_t sVar5;
  Data<QHashPrivate::Node<ProKey,_ProString>_> *pDVar6;
  Node<ProKey,_ProString> *n;
  ulong uVar7;
  long in_FS_OFFSET;
  Bucket BVar8;
  Bucket local_50;
  QHash<ProKey,_ProString> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *this;
  if (lVar4 == 0) {
    QHash<ProKey,_ProString>::detach((QHash<ProKey,_ProString> *)this);
    lVar4 = *this;
  }
  local_40.d = (Data *)0x0;
  uVar7 = *(ulong *)(lVar4 + 0x18);
  sVar5 = qHash(&key->super_ProString);
  uVar7 = sVar5 ^ uVar7;
  BVar8 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::findBucketWithHash<ProKey>
                    (*this,key,uVar7);
  uVar1 = (BVar8.span)->offsets[BVar8.index];
  pDVar6 = *this;
  local_50 = BVar8;
  if ((pDVar6 == (Data<QHashPrivate::Node<ProKey,_ProString>_> *)0x0) ||
     (1 < (uint)(pDVar6->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_00214e84:
    QHash<ProKey,_ProString>::operator=(&local_40,(QHash<ProKey,_ProString> *)this);
    pDVar6 = *this;
    if ((uVar1 == 0xff) && (pDVar6->numBuckets >> 1 <= pDVar6->size)) {
      pDVar6 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::detached
                         (pDVar6,pDVar6->size + 1);
      *(Data<QHashPrivate::Node<ProKey,_ProString>_> **)this = pDVar6;
      local_50 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::
                 findBucketWithHash<ProKey>(pDVar6,key,uVar7);
    }
    else {
      pSVar2 = pDVar6->spans;
      pDVar6 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::detached(pDVar6);
      *(Data<QHashPrivate::Node<ProKey,_ProString>_> **)this = pDVar6;
      local_50.index._0_4_ = (uint)BVar8.index & 0x7f;
      BVar3.index._0_4_ = (uint)local_50.index;
      BVar3.span = pDVar6->spans +
                   ((((long)BVar8.span - (long)pSVar2) / 0x90 << 7 | BVar8.index) >> 7);
      BVar3.index._4_4_ = 0;
      local_50.span =
           pDVar6->spans + ((((long)BVar8.span - (long)pSVar2) / 0x90 << 7 | BVar8.index) >> 7);
      local_50.index._4_4_ = 0;
      if (uVar1 != 0xff) {
        pDVar6 = *this;
        BVar8 = BVar3;
        goto LAB_00214f46;
      }
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00214f46;
    if (pDVar6->numBuckets >> 1 <= pDVar6->size) goto LAB_00214e84;
  }
  n = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::Bucket::insert(&local_50);
  QHashPrivate::Node<ProKey,_ProString>::createInPlace<>(n,key);
  pDVar6 = *this;
  pDVar6->size = pDVar6->size + 1;
  BVar8 = local_50;
LAB_00214f46:
  pSVar2 = pDVar6->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar6;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)BVar8.span - (long)pSVar2) / 0x90 << 7 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<ProKey,_ProString>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }